

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O3

void av1_get_block_hash_value
               (IntraBCHashInfo *intrabc_hash_info,uint8_t *y_src,int stride,int block_size,
               uint32_t *hash_value1,uint32_t *hash_value2,int use_highbitdepth)

{
  uint32_t *puVar1;
  IntraBCHashInfo *pIVar2;
  uint *puVar3;
  bool bVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  uint16_t *p_pel;
  ulong uVar8;
  uint8_t *puVar9;
  bool bVar10;
  long lVar11;
  int x_pos_1;
  int iVar12;
  uint uVar13;
  long lVar14;
  CRC_CALCULATOR *pCVar15;
  ulong uVar16;
  int x_pos;
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint32_t to_hash [4];
  uint local_e0;
  uint32_t local_c8;
  uint32_t local_c4;
  uint32_t local_c0;
  uint32_t local_bc;
  ulong local_b8;
  ulong local_b0;
  IntraBCHashInfo *local_a8;
  ulong local_a0;
  ulong local_98;
  CRC_CALCULATOR *local_90;
  CRC_CALCULATOR *local_88;
  int local_7c;
  uint local_78;
  uint local_74;
  uint *local_70;
  uint32_t *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_88 = &intrabc_hash_info->crc_calculator1;
  local_90 = &intrabc_hash_info->crc_calculator2;
  local_b8 = (ulong)(uint)(block_size >> 1);
  local_a8 = intrabc_hash_info;
  local_70 = hash_value1;
  local_68 = hash_value2;
  if (use_highbitdepth == 0) {
    if (0 < block_size) {
      local_b0 = (ulong)(uint)block_size;
      uVar8 = 0;
      local_a0 = local_b8;
      do {
        lVar18 = (uVar8 >> 1) * local_a0;
        uVar17 = 0;
        local_98 = uVar8;
        do {
          pCVar15 = local_88;
          puVar9 = y_src + uVar17 + uVar8 * (long)stride;
          lVar19 = 0;
          bVar4 = true;
          do {
            bVar10 = bVar4;
            lVar19 = (long)(int)lVar19;
            iVar12 = 2;
            lVar11 = 0;
            do {
              *(uint8_t *)((long)&local_c8 + lVar19) = puVar9[lVar11];
              lVar19 = lVar19 + 1;
              lVar11 = 1;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
            puVar9 = puVar9 + stride;
            bVar4 = false;
          } while (bVar10);
          lVar19 = (uVar17 >> 1) + lVar18;
          uVar6 = av1_get_crc_value(pCVar15,(uint8_t *)&local_c8,4);
          intrabc_hash_info->hash_value_buffer[0][0][lVar19] = uVar6;
          uVar6 = av1_get_crc_value(local_90,(uint8_t *)&local_c8,4);
          intrabc_hash_info->hash_value_buffer[1][0][lVar19] = uVar6;
          uVar17 = uVar17 + 2;
        } while ((int)uVar17 < block_size);
        uVar8 = local_98 + 2;
      } while (uVar8 < local_b0);
    }
  }
  else if (0 < block_size) {
    local_b0 = (ulong)(uint)block_size;
    uVar8 = 0;
    local_a0 = local_b8;
    do {
      lVar18 = (uVar8 >> 1) * local_a0;
      uVar17 = 0;
      local_98 = uVar8;
      do {
        pCVar15 = local_88;
        lVar19 = (long)y_src * 2 + uVar8 * (long)stride * 2 + uVar17 * 2;
        lVar11 = 0;
        bVar4 = true;
        do {
          bVar10 = bVar4;
          lVar11 = (long)(int)lVar11;
          iVar12 = 2;
          lVar14 = 0;
          do {
            *(undefined2 *)((long)&local_c8 + lVar11 * 2) = *(undefined2 *)(lVar19 + lVar14 * 2);
            lVar11 = lVar11 + 1;
            lVar14 = 1;
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
          lVar19 = lVar19 + (long)stride * 2;
          bVar4 = false;
        } while (bVar10);
        lVar19 = (uVar17 >> 1) + lVar18;
        uVar6 = av1_get_crc_value(pCVar15,(uint8_t *)&local_c8,8);
        intrabc_hash_info->hash_value_buffer[0][0][lVar19] = uVar6;
        uVar6 = av1_get_crc_value(local_90,(uint8_t *)&local_c8,8);
        intrabc_hash_info->hash_value_buffer[1][0][lVar19] = uVar6;
        uVar17 = uVar17 + 2;
      } while ((int)uVar17 < block_size);
      uVar8 = local_98 + 2;
    } while (uVar8 < local_b0);
  }
  uVar8 = 0;
  if (3 < block_size) {
    uVar13 = (uint)block_size >> 2;
    local_e0 = 1;
    iVar12 = 4;
    uVar17 = local_b8;
    pCVar15 = local_88;
    local_60 = uVar8;
    do {
      local_e0 = 1 - local_e0;
      uVar8 = (ulong)(1 - (int)local_60);
      local_7c = iVar12;
      local_60 = uVar8;
      if (uVar13 != 0) {
        local_50 = (ulong)uVar13;
        local_58 = (ulong)(uint)((int)uVar17 * 2);
        uVar17 = uVar17 & 0xffffffff;
        local_40 = local_50 * 2;
        uVar16 = 0;
        local_48 = 0;
        local_78 = uVar13;
        uVar5 = 0;
        do {
          local_74 = uVar5;
          iVar12 = (int)local_48;
          local_48 = local_50 + (long)iVar12;
          local_38 = (long)iVar12 << 2;
          lVar18 = 0;
          local_b8 = uVar16;
          local_b0 = uVar17;
          do {
            pIVar2 = local_a8;
            iVar12 = (int)lVar18;
            puVar1 = local_a8->hash_value_buffer[0][local_e0];
            local_98 = (ulong)((int)local_b8 + iVar12);
            local_c8 = puVar1[local_98];
            iVar7 = (int)local_b8 + 1 + iVar12;
            local_c4 = puVar1[iVar7];
            local_a0 = (ulong)((int)local_b0 + iVar12);
            local_c0 = puVar1[local_a0];
            iVar12 = (int)local_b0 + 1 + iVar12;
            local_bc = puVar1[iVar12];
            uVar6 = av1_get_crc_value(pCVar15,(uint8_t *)&local_c8,0x10);
            lVar19 = local_38;
            *(uint32_t *)((long)pIVar2->hash_value_buffer[0][uVar8] + lVar18 * 2 + local_38) = uVar6
            ;
            puVar1 = pIVar2->hash_value_buffer[1][local_e0];
            local_c8 = puVar1[local_98];
            local_c4 = puVar1[iVar7];
            local_c0 = puVar1[local_a0];
            local_bc = puVar1[iVar12];
            uVar6 = av1_get_crc_value(local_90,(uint8_t *)&local_c8,0x10);
            *(uint32_t *)((long)pIVar2->hash_value_buffer[1][uVar8] + lVar18 * 2 + lVar19) = uVar6;
            lVar18 = lVar18 + 2;
            pCVar15 = local_88;
          } while (local_40 != lVar18);
          uVar16 = local_b8 + local_58;
          uVar17 = local_b0 + local_58;
          uVar13 = local_78;
          uVar5 = local_74 + 1;
        } while (local_74 + 1 != local_78);
      }
      uVar17 = (ulong)uVar13;
      uVar13 = uVar13 >> 1;
      iVar12 = local_7c * 2;
    } while (iVar12 <= block_size);
    uVar8 = local_60 & 0xffffffff;
  }
  puVar1 = local_68;
  puVar3 = local_70;
  pIVar2 = local_a8;
  iVar12 = hash_block_size_to_index(block_size);
  *puVar3 = (uint)(ushort)*pIVar2->hash_value_buffer[0][uVar8] | iVar12 << 0x10;
  *puVar1 = *pIVar2->hash_value_buffer[1][uVar8];
  return;
}

Assistant:

void av1_get_block_hash_value(IntraBCHashInfo *intrabc_hash_info,
                              const uint8_t *y_src, int stride, int block_size,
                              uint32_t *hash_value1, uint32_t *hash_value2,
                              int use_highbitdepth) {
  int add_value = hash_block_size_to_index(block_size);
  assert(add_value >= 0);
  add_value <<= kSrcBits;
  const int crc_mask = (1 << kSrcBits) - 1;

  CRC_CALCULATOR *calc_1 = &intrabc_hash_info->crc_calculator1;
  CRC_CALCULATOR *calc_2 = &intrabc_hash_info->crc_calculator2;
  uint32_t **buf_1 = intrabc_hash_info->hash_value_buffer[0];
  uint32_t **buf_2 = intrabc_hash_info->hash_value_buffer[1];

  // 2x2 subblock hash values in current CU
  int sub_block_in_width = (block_size >> 1);
  if (use_highbitdepth) {
    uint16_t pixel_to_hash[4];
    uint16_t *y16_src = CONVERT_TO_SHORTPTR(y_src);
    for (int y_pos = 0; y_pos < block_size; y_pos += 2) {
      for (int x_pos = 0; x_pos < block_size; x_pos += 2) {
        int pos = (y_pos >> 1) * sub_block_in_width + (x_pos >> 1);
        get_pixels_in_1D_short_array_by_block_2x2(
            y16_src + y_pos * stride + x_pos, stride, pixel_to_hash);
        assert(pos < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        buf_1[0][pos] = av1_get_crc_value(calc_1, (uint8_t *)pixel_to_hash,
                                          sizeof(pixel_to_hash));
        buf_2[0][pos] = av1_get_crc_value(calc_2, (uint8_t *)pixel_to_hash,
                                          sizeof(pixel_to_hash));
      }
    }
  } else {
    uint8_t pixel_to_hash[4];
    for (int y_pos = 0; y_pos < block_size; y_pos += 2) {
      for (int x_pos = 0; x_pos < block_size; x_pos += 2) {
        int pos = (y_pos >> 1) * sub_block_in_width + (x_pos >> 1);
        get_pixels_in_1D_char_array_by_block_2x2(y_src + y_pos * stride + x_pos,
                                                 stride, pixel_to_hash);
        assert(pos < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        buf_1[0][pos] =
            av1_get_crc_value(calc_1, pixel_to_hash, sizeof(pixel_to_hash));
        buf_2[0][pos] =
            av1_get_crc_value(calc_2, pixel_to_hash, sizeof(pixel_to_hash));
      }
    }
  }

  int src_sub_block_in_width = sub_block_in_width;
  sub_block_in_width >>= 1;

  int src_idx = 1;
  int dst_idx = 0;

  // 4x4 subblock hash values to current block hash values
  uint32_t to_hash[4];
  for (int sub_width = 4; sub_width <= block_size; sub_width *= 2) {
    src_idx = 1 - src_idx;
    dst_idx = 1 - dst_idx;

    int dst_pos = 0;
    for (int y_pos = 0; y_pos < sub_block_in_width; y_pos++) {
      for (int x_pos = 0; x_pos < sub_block_in_width; x_pos++) {
        int srcPos = (y_pos << 1) * src_sub_block_in_width + (x_pos << 1);

        assert(srcPos + 1 < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        assert(srcPos + src_sub_block_in_width + 1 <
               AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        assert(dst_pos < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        to_hash[0] = buf_1[src_idx][srcPos];
        to_hash[1] = buf_1[src_idx][srcPos + 1];
        to_hash[2] = buf_1[src_idx][srcPos + src_sub_block_in_width];
        to_hash[3] = buf_1[src_idx][srcPos + src_sub_block_in_width + 1];

        buf_1[dst_idx][dst_pos] =
            av1_get_crc_value(calc_1, (uint8_t *)to_hash, sizeof(to_hash));

        to_hash[0] = buf_2[src_idx][srcPos];
        to_hash[1] = buf_2[src_idx][srcPos + 1];
        to_hash[2] = buf_2[src_idx][srcPos + src_sub_block_in_width];
        to_hash[3] = buf_2[src_idx][srcPos + src_sub_block_in_width + 1];
        buf_2[dst_idx][dst_pos] =
            av1_get_crc_value(calc_2, (uint8_t *)to_hash, sizeof(to_hash));
        dst_pos++;
      }
    }

    src_sub_block_in_width = sub_block_in_width;
    sub_block_in_width >>= 1;
  }

  *hash_value1 = (buf_1[dst_idx][0] & crc_mask) + add_value;
  *hash_value2 = buf_2[dst_idx][0];
}